

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
write_int<long_long,duckdb_fmt::v6::basic_format_specs<wchar_t>>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *this,longlong value,
          basic_format_specs<wchar_t> *spec)

{
  byte bVar1;
  int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> local_20;
  
  local_20.prefix_size = 0;
  if (value < 0) {
    local_20.prefix[0] = '-';
    local_20.prefix_size = 1;
    local_20.abs_value = -value;
  }
  else {
    bVar1 = (byte)spec->field_0x9 >> 4 & 7;
    local_20.abs_value = value;
    if (1 < bVar1) {
      local_20.prefix[0] = ' ';
      if (bVar1 == 2) {
        local_20.prefix[0] = '+';
      }
      local_20.prefix_size = 1;
    }
  }
  local_20.writer = (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *)this;
  local_20.specs = spec;
  handle_int_type_spec<duckdb_fmt::v6::basic_format_specs<wchar_t>,duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<wchar_t>>>
            (spec,&local_20);
  return;
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec, int_writer<T, Spec>(*this, value, spec));
  }